

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_NtkCountRoots(Vec_Int_t *vWinObjs,int PivotVar)

{
  int iVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = PivotVar + 1; i < vWinObjs->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vWinObjs,i);
    iVar1 = Abc_LitIsCompl(iVar1);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Acb_NtkCountRoots( Vec_Int_t * vWinObjs, int PivotVar )
{
    int i, iObjLit, nRoots = 0;
    Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, PivotVar + 1 )
        nRoots += Abc_LitIsCompl(iObjLit);
    return nRoots;
}